

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O1

void __thiscall cursespp::LayoutBase::SetFocus(LayoutBase *this)

{
  IWindowPtr *in_RSI;
  
  SetFocus((LayoutBase *)&this[-1].super_Window.width,in_RSI);
  return;
}

Assistant:

bool LayoutBase::SetFocus(IWindowPtr focus) {
    if (!focus) {
        this->focused = NO_FOCUS;
        this->EnsureValidFocus();
        return true;
    }
    else {
        for (size_t i = 0; i < this->focusable.size(); i++) {
            if (this->focusable[i] == focus) {
                /* if we're focused, we need to ensure our parent sets its correct
                focus index to us! and so on up to the root view. note that this
                needs to be called before updating our internal focus; recursively,
                parents need to have their focus index set before children */
                auto asLayout = dynamic_cast<ILayout*>(this->GetParent());
                if (asLayout) {
                    asLayout->SetFocus(shared_from_this());
                }
                this->focused = i;
                this->EnsureValidFocus();
                return true;
            }
        }
    }
    return false;
}